

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack14_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar1 = *in;
  *out = uVar1 & 0x3fff;
  out[1] = uVar1 >> 0xe & 0x3fff;
  uVar2 = in[1];
  out[2] = uVar1 >> 0x1c;
  out[2] = uVar1 >> 0x1c | (uVar2 & 0x3ff) << 4;
  uVar1 = in[2];
  out[3] = uVar2 >> 10 & 0x3fff;
  out[4] = uVar2 >> 0x18;
  out[4] = uVar2 >> 0x18 | (uVar1 & 0x3f) << 8;
  out[5] = uVar1 >> 6 & 0x3fff;
  out[6] = uVar1 >> 0x14;
  uVar2 = in[3];
  out[6] = uVar1 >> 0x14 | (uVar2 & 3) << 0xc;
  auVar5 = vpbroadcastd_avx512vl();
  auVar5 = vpsrlvd_avx2(auVar5,_DAT_001ad3f0);
  auVar6._8_4_ = 0x3fff;
  auVar6._0_8_ = 0x3fff00003fff;
  auVar6._12_4_ = 0x3fff;
  auVar5 = vpand_avx(auVar5,auVar6);
  *(long *)(out + 7) = auVar5._0_8_;
  uVar1 = in[4];
  out[9] = uVar2 >> 0x1e;
  out[9] = uVar2 >> 0x1e | (uVar1 & 0xfff) << 2;
  out[10] = uVar1 >> 0xc & 0x3fff;
  uVar2 = in[5];
  out[0xb] = uVar1 >> 0x1a;
  out[0xb] = uVar1 >> 0x1a | (uVar2 & 0xff) << 6;
  out[0xc] = uVar2 >> 8 & 0x3fff;
  out[0xd] = uVar2 >> 0x16;
  uVar3 = *(ulong *)(in + 6);
  out[0xd] = uVar2 >> 0x16 | ((uint)uVar3 & 0xf) << 10;
  out[0xe] = (uint)uVar3 >> 4 & 0x3fff;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar3;
  auVar5 = vpinsrd_avx(auVar5,(uint)(uVar3 >> 0x2e),2);
  auVar4 = vpshufd_avx(auVar5,100);
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_001a9060);
  auVar5 = vpand_avx(auVar5,auVar6);
  auVar5 = vpblendd_avx2(auVar4,auVar5,6);
  *(undefined1 (*) [16])(out + 0xf) = auVar5;
  uVar1 = in[8];
  out[0x12] = auVar4._12_4_ | (uVar1 & 0x3ff) << 4;
  out[0x13] = uVar1 >> 10 & 0x3fff;
  out[0x14] = uVar1 >> 0x18;
  uVar2 = in[9];
  out[0x14] = uVar1 >> 0x18 | (uVar2 & 0x3f) << 8;
  out[0x15] = uVar2 >> 6 & 0x3fff;
  out[0x16] = uVar2 >> 0x14;
  uVar1 = in[10];
  out[0x16] = uVar2 >> 0x14 | (uVar1 & 3) << 0xc;
  out[0x17] = uVar1 >> 2 & 0x3fff;
  return in + 0xb;
}

Assistant:

const uint32_t *__fastunpack14_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 14);
  out++;
  *out = ((*in) >> 14) % (1U << 14);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 10)) << (14 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 14);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 6)) << (14 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 14);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 2)) << (14 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 14);
  out++;
  *out = ((*in) >> 16) % (1U << 14);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 12)) << (14 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 14);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 8)) << (14 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 14);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 4)) << (14 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 14);
  out++;
  *out = ((*in) >> 18);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 14);
  out++;
  *out = ((*in) >> 14) % (1U << 14);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 10)) << (14 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 14);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 6)) << (14 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 14);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 2)) << (14 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 14);
  out++;

  return in + 1;
}